

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::BinaryOp> * __thiscall
wasm::Random::FeatureOptions<wasm::BinaryOp>::
add<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
          (FeatureOptions<wasm::BinaryOp> *this,undefined4 feature,BinaryOp option,undefined4 rest,
          undefined4 rest_1,undefined4 rest_2,undefined4 rest_3,undefined4 rest_4,undefined4 rest_5,
          undefined4 rest_6,undefined4 rest_7,undefined4 rest_8,undefined4 rest_9,undefined4 rest_10
          ,undefined4 rest_11,undefined4 rest_12,undefined4 rest_13,undefined4 rest_14,
          undefined4 rest_15,undefined4 rest_16,undefined4 rest_17,undefined4 rest_18,
          undefined4 rest_19,undefined4 rest_20,undefined4 rest_21,undefined4 rest_22,
          undefined4 rest_23,undefined4 rest_24,undefined4 rest_25,undefined4 rest_26,
          undefined4 rest_27,undefined4 rest_28,undefined4 rest_29,undefined4 rest_30,
          undefined4 rest_31,undefined4 rest_32,undefined4 rest_33,undefined4 rest_34,
          undefined4 rest_35,undefined4 rest_36,undefined4 rest_37,undefined4 rest_38,
          undefined4 rest_39,undefined4 rest_40,undefined4 rest_41,undefined4 rest_42,
          undefined4 rest_43,undefined4 rest_44,undefined4 rest_45,undefined4 rest_46,
          undefined4 rest_47,undefined4 rest_48,undefined4 rest_49,undefined4 rest_50,
          undefined4 rest_51,undefined4 rest_52,undefined4 rest_53,undefined4 rest_54,
          undefined4 rest_55,undefined4 rest_56,undefined4 rest_57,undefined4 rest_58,
          undefined4 rest_59,undefined4 rest_60,undefined4 rest_61,undefined4 rest_62,
          undefined4 rest_63,undefined4 rest_64,undefined4 param_69)

{
  mapped_type *this_00;
  FeatureOptions<wasm::BinaryOp> *pFVar1;
  undefined4 in_stack_00000200;
  BinaryOp rest_local_2;
  BinaryOp rest_local_1;
  BinaryOp rest_local;
  BinaryOp option_local;
  FeatureOptions<wasm::BinaryOp> *this_local;
  FeatureSet feature_local;
  
  rest_local_1 = option;
  _rest_local = this;
  this_local._4_4_ = feature;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&this_local + 4));
  std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>::push_back(this_00,&rest_local_1);
  pFVar1 = add<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                     (this,this_local._4_4_,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,
                      rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,
                      rest_18,rest_19,rest_20,rest_21,rest_22,rest_23,rest_24,rest_25,rest_26,
                      rest_27,rest_28,rest_29,rest_30,rest_31,rest_32,rest_33,rest_34,rest_35,
                      rest_36,rest_37,rest_38,rest_39,rest_40,rest_41,rest_42,rest_43,rest_44,
                      rest_45,rest_46,rest_47,rest_48,rest_49,rest_50,rest_51,rest_52,rest_53,
                      rest_54,rest_55,rest_56,rest_57,rest_58,rest_59,rest_60,rest_61,rest_62,
                      rest_63,rest_64,param_69,in_stack_00000200);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }